

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void * mpack_expect_array_alloc_impl
                 (mpack_reader_t *reader,size_t element_size,uint32_t max_count,uint32_t *out_count,
                 _Bool allow_nil)

{
  uint32_t uVar1;
  undefined8 in_RAX;
  void *pvVar2;
  undefined3 in_register_00000081;
  undefined4 uStack_28;
  uint32_t count;
  
  *out_count = 0;
  _uStack_28 = in_RAX;
  if (CONCAT31(in_register_00000081,allow_nil) == 0) {
    uVar1 = mpack_expect_array_max(reader,max_count);
    _uStack_28 = CONCAT44(uVar1,uStack_28);
  }
  else {
    mpack_expect_array_max_or_nil(reader,max_count,&count);
  }
  if (reader->error == mpack_ok) {
    uVar1 = count;
    if ((ulong)count != 0) {
      pvVar2 = malloc(element_size * count);
      if (pvVar2 != (void *)0x0) {
        *out_count = uVar1;
        return pvVar2;
      }
      mpack_reader_flag_error(reader,mpack_error_memory);
    }
  }
  return (void *)0x0;
}

Assistant:

void* mpack_expect_array_alloc_impl(mpack_reader_t* reader, size_t element_size, uint32_t max_count, uint32_t* out_count, bool allow_nil) {
    mpack_assert(out_count != NULL, "out_count cannot be NULL");
    *out_count = 0;

    uint32_t count;
    bool has_array = true;
    if (allow_nil)
        has_array = mpack_expect_array_max_or_nil(reader, max_count, &count);
    else
        count = mpack_expect_array_max(reader, max_count);
    if (mpack_reader_error(reader))
        return NULL;

    // size 0 is not an error; we return NULL for no elements.
    if (count == 0) {
        // we call mpack_done_array() automatically ONLY if we are using
        // the _or_nil variant. this is the only way to allow nil and empty
        // to work the same way.
        if (allow_nil && has_array)
            mpack_done_array(reader);
        return NULL;
    }

    void* p = MPACK_MALLOC(element_size * count);
    if (p == NULL) {
        mpack_reader_flag_error(reader, mpack_error_memory);
        return NULL;
    }

    *out_count = count;
    return p;
}